

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_image_resize2.h
# Opt level: O0

void stbir__vertical_scatter_with_8_coeffs_cont
               (float **outputs,float *vertical_coefficients,float *input,float *input_end)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float r;
  __m128 r0_1;
  __m128 o0_1;
  __m128 r3;
  __m128 r2;
  __m128 r1;
  __m128 r0;
  __m128 o3;
  __m128 o2;
  __m128 o1;
  __m128 o0;
  __m128 c7;
  __m128 c6;
  __m128 c5;
  __m128 c4;
  __m128 c3;
  __m128 c2;
  __m128 c1;
  __m128 c0;
  float *pfStack_1228;
  float c7s;
  float *output7;
  float *pfStack_1218;
  float c6s;
  float *output6;
  float *pfStack_1208;
  float c5s;
  float *output5;
  float *pfStack_11f8;
  float c4s;
  float *output4;
  float *pfStack_11e8;
  float c3s;
  float *output3;
  float *pfStack_11d8;
  float c2s;
  float *output2;
  float *pfStack_11c8;
  float c1s;
  float *output1;
  float *pfStack_11b8;
  float c0s;
  float *output0;
  float *input_end_local;
  float *input_local;
  float *vertical_coefficients_local;
  float **outputs_local;
  float local_a38;
  float fStack_a34;
  float fStack_a30;
  float fStack_a2c;
  float local_698;
  float fStack_694;
  float fStack_690;
  float fStack_68c;
  float local_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float local_658;
  float fStack_654;
  float fStack_650;
  float fStack_64c;
  float local_638;
  float fStack_634;
  float fStack_630;
  float fStack_62c;
  float local_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float local_5f8;
  float fStack_5f4;
  float fStack_5f0;
  float fStack_5ec;
  float local_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float local_5b8;
  float fStack_5b4;
  float fStack_5b0;
  float fStack_5ac;
  float local_598;
  float fStack_594;
  float fStack_590;
  float fStack_58c;
  float local_578;
  float fStack_574;
  float fStack_570;
  float fStack_56c;
  float local_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float local_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float local_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float local_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float local_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float local_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float local_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float local_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float local_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float local_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float local_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float local_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float local_338;
  float fStack_334;
  float fStack_330;
  float fStack_32c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  float local_2f8;
  float fStack_2f4;
  float fStack_2f0;
  float fStack_2ec;
  float local_2d8;
  float fStack_2d4;
  float fStack_2d0;
  float fStack_2cc;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float local_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float local_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float local_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float local_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float local_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float local_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_138;
  float fStack_134;
  float fStack_130;
  float fStack_12c;
  
  pfStack_11b8 = *outputs;
  fVar1 = *vertical_coefficients;
  pfStack_11c8 = outputs[1];
  fVar2 = vertical_coefficients[1];
  pfStack_11d8 = outputs[2];
  fVar3 = vertical_coefficients[2];
  pfStack_11e8 = outputs[3];
  fVar4 = vertical_coefficients[3];
  pfStack_11f8 = outputs[4];
  fVar5 = vertical_coefficients[4];
  pfStack_1208 = outputs[5];
  fVar6 = vertical_coefficients[5];
  pfStack_1218 = outputs[6];
  fVar7 = vertical_coefficients[6];
  pfStack_1228 = outputs[7];
  fVar8 = vertical_coefficients[7];
  for (input_end_local = input; 0x3f < (long)input_end - (long)input_end_local;
      input_end_local = input_end_local + 0x10) {
    local_638 = (float)*(undefined8 *)input_end_local;
    fStack_634 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_630 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_62c = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_138 = (float)*(undefined8 *)pfStack_11b8;
    fStack_134 = (float)((ulong)*(undefined8 *)pfStack_11b8 >> 0x20);
    fStack_130 = (float)*(undefined8 *)(pfStack_11b8 + 2);
    fStack_12c = (float)((ulong)*(undefined8 *)(pfStack_11b8 + 2) >> 0x20);
    o1[3] = fStack_134 + fStack_634 * fVar1;
    o1[2] = local_138 + local_638 * fVar1;
    o0[1] = fStack_12c + fStack_62c * fVar1;
    o0[0] = fStack_130 + fStack_630 * fVar1;
    local_658 = (float)*(undefined8 *)(input_end_local + 4);
    fStack_654 = (float)((ulong)*(undefined8 *)(input_end_local + 4) >> 0x20);
    fStack_650 = (float)*(undefined8 *)(input_end_local + 6);
    fStack_64c = (float)((ulong)*(undefined8 *)(input_end_local + 6) >> 0x20);
    local_158 = (float)*(undefined8 *)(pfStack_11b8 + 4);
    fStack_154 = (float)((ulong)*(undefined8 *)(pfStack_11b8 + 4) >> 0x20);
    fStack_150 = (float)*(undefined8 *)(pfStack_11b8 + 6);
    fStack_14c = (float)((ulong)*(undefined8 *)(pfStack_11b8 + 6) >> 0x20);
    o2[3] = fStack_154 + fStack_654 * fVar1;
    o2[2] = local_158 + local_658 * fVar1;
    o1[1] = fStack_14c + fStack_64c * fVar1;
    o1[0] = fStack_150 + fStack_650 * fVar1;
    local_678 = (float)*(undefined8 *)(input_end_local + 8);
    fStack_674 = (float)((ulong)*(undefined8 *)(input_end_local + 8) >> 0x20);
    fStack_670 = (float)*(undefined8 *)(input_end_local + 10);
    fStack_66c = (float)((ulong)*(undefined8 *)(input_end_local + 10) >> 0x20);
    local_178 = (float)*(undefined8 *)(pfStack_11b8 + 8);
    fStack_174 = (float)((ulong)*(undefined8 *)(pfStack_11b8 + 8) >> 0x20);
    fStack_170 = (float)*(undefined8 *)(pfStack_11b8 + 10);
    fStack_16c = (float)((ulong)*(undefined8 *)(pfStack_11b8 + 10) >> 0x20);
    o3[3] = fStack_174 + fStack_674 * fVar1;
    o3[2] = local_178 + local_678 * fVar1;
    o2[1] = fStack_16c + fStack_66c * fVar1;
    o2[0] = fStack_170 + fStack_670 * fVar1;
    local_698 = (float)*(undefined8 *)(input_end_local + 0xc);
    fStack_694 = (float)((ulong)*(undefined8 *)(input_end_local + 0xc) >> 0x20);
    fStack_690 = (float)*(undefined8 *)(input_end_local + 0xe);
    fStack_68c = (float)((ulong)*(undefined8 *)(input_end_local + 0xe) >> 0x20);
    local_198 = (float)*(undefined8 *)(pfStack_11b8 + 0xc);
    fStack_194 = (float)((ulong)*(undefined8 *)(pfStack_11b8 + 0xc) >> 0x20);
    fStack_190 = (float)*(undefined8 *)(pfStack_11b8 + 0xe);
    fStack_18c = (float)((ulong)*(undefined8 *)(pfStack_11b8 + 0xe) >> 0x20);
    r0[3] = fStack_194 + fStack_694 * fVar1;
    r0[2] = local_198 + local_698 * fVar1;
    o3[1] = fStack_18c + fStack_68c * fVar1;
    o3[0] = fStack_190 + fStack_690 * fVar1;
    *(undefined8 *)pfStack_11b8 = o1._8_8_;
    *(undefined8 *)(pfStack_11b8 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_11b8 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_11b8 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_11b8 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_11b8 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_11b8 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_11b8 + 0xe) = o3._0_8_;
    local_1b8 = (float)*(undefined8 *)pfStack_11c8;
    fStack_1b4 = (float)((ulong)*(undefined8 *)pfStack_11c8 >> 0x20);
    fStack_1b0 = (float)*(undefined8 *)(pfStack_11c8 + 2);
    fStack_1ac = (float)((ulong)*(undefined8 *)(pfStack_11c8 + 2) >> 0x20);
    o1[3] = fStack_1b4 + fStack_634 * fVar2;
    o1[2] = local_1b8 + local_638 * fVar2;
    o0[1] = fStack_1ac + fStack_62c * fVar2;
    o0[0] = fStack_1b0 + fStack_630 * fVar2;
    local_1d8 = (float)*(undefined8 *)(pfStack_11c8 + 4);
    fStack_1d4 = (float)((ulong)*(undefined8 *)(pfStack_11c8 + 4) >> 0x20);
    fStack_1d0 = (float)*(undefined8 *)(pfStack_11c8 + 6);
    fStack_1cc = (float)((ulong)*(undefined8 *)(pfStack_11c8 + 6) >> 0x20);
    o2[3] = fStack_1d4 + fStack_654 * fVar2;
    o2[2] = local_1d8 + local_658 * fVar2;
    o1[1] = fStack_1cc + fStack_64c * fVar2;
    o1[0] = fStack_1d0 + fStack_650 * fVar2;
    local_1f8 = (float)*(undefined8 *)(pfStack_11c8 + 8);
    fStack_1f4 = (float)((ulong)*(undefined8 *)(pfStack_11c8 + 8) >> 0x20);
    fStack_1f0 = (float)*(undefined8 *)(pfStack_11c8 + 10);
    fStack_1ec = (float)((ulong)*(undefined8 *)(pfStack_11c8 + 10) >> 0x20);
    o3[3] = fStack_1f4 + fStack_674 * fVar2;
    o3[2] = local_1f8 + local_678 * fVar2;
    o2[1] = fStack_1ec + fStack_66c * fVar2;
    o2[0] = fStack_1f0 + fStack_670 * fVar2;
    local_218 = (float)*(undefined8 *)(pfStack_11c8 + 0xc);
    fStack_214 = (float)((ulong)*(undefined8 *)(pfStack_11c8 + 0xc) >> 0x20);
    fStack_210 = (float)*(undefined8 *)(pfStack_11c8 + 0xe);
    fStack_20c = (float)((ulong)*(undefined8 *)(pfStack_11c8 + 0xe) >> 0x20);
    r0[3] = fStack_214 + fStack_694 * fVar2;
    r0[2] = local_218 + local_698 * fVar2;
    o3[1] = fStack_20c + fStack_68c * fVar2;
    o3[0] = fStack_210 + fStack_690 * fVar2;
    *(undefined8 *)pfStack_11c8 = o1._8_8_;
    *(undefined8 *)(pfStack_11c8 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_11c8 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_11c8 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_11c8 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_11c8 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_11c8 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_11c8 + 0xe) = o3._0_8_;
    local_238 = (float)*(undefined8 *)pfStack_11d8;
    fStack_234 = (float)((ulong)*(undefined8 *)pfStack_11d8 >> 0x20);
    fStack_230 = (float)*(undefined8 *)(pfStack_11d8 + 2);
    fStack_22c = (float)((ulong)*(undefined8 *)(pfStack_11d8 + 2) >> 0x20);
    o1[3] = fStack_234 + fStack_634 * fVar3;
    o1[2] = local_238 + local_638 * fVar3;
    o0[1] = fStack_22c + fStack_62c * fVar3;
    o0[0] = fStack_230 + fStack_630 * fVar3;
    local_258 = (float)*(undefined8 *)(pfStack_11d8 + 4);
    fStack_254 = (float)((ulong)*(undefined8 *)(pfStack_11d8 + 4) >> 0x20);
    fStack_250 = (float)*(undefined8 *)(pfStack_11d8 + 6);
    fStack_24c = (float)((ulong)*(undefined8 *)(pfStack_11d8 + 6) >> 0x20);
    o2[3] = fStack_254 + fStack_654 * fVar3;
    o2[2] = local_258 + local_658 * fVar3;
    o1[1] = fStack_24c + fStack_64c * fVar3;
    o1[0] = fStack_250 + fStack_650 * fVar3;
    local_278 = (float)*(undefined8 *)(pfStack_11d8 + 8);
    fStack_274 = (float)((ulong)*(undefined8 *)(pfStack_11d8 + 8) >> 0x20);
    fStack_270 = (float)*(undefined8 *)(pfStack_11d8 + 10);
    fStack_26c = (float)((ulong)*(undefined8 *)(pfStack_11d8 + 10) >> 0x20);
    o3[3] = fStack_274 + fStack_674 * fVar3;
    o3[2] = local_278 + local_678 * fVar3;
    o2[1] = fStack_26c + fStack_66c * fVar3;
    o2[0] = fStack_270 + fStack_670 * fVar3;
    local_298 = (float)*(undefined8 *)(pfStack_11d8 + 0xc);
    fStack_294 = (float)((ulong)*(undefined8 *)(pfStack_11d8 + 0xc) >> 0x20);
    fStack_290 = (float)*(undefined8 *)(pfStack_11d8 + 0xe);
    fStack_28c = (float)((ulong)*(undefined8 *)(pfStack_11d8 + 0xe) >> 0x20);
    r0[3] = fStack_294 + fStack_694 * fVar3;
    r0[2] = local_298 + local_698 * fVar3;
    o3[1] = fStack_28c + fStack_68c * fVar3;
    o3[0] = fStack_290 + fStack_690 * fVar3;
    *(undefined8 *)pfStack_11d8 = o1._8_8_;
    *(undefined8 *)(pfStack_11d8 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_11d8 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_11d8 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_11d8 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_11d8 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_11d8 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_11d8 + 0xe) = o3._0_8_;
    local_2b8 = (float)*(undefined8 *)pfStack_11e8;
    fStack_2b4 = (float)((ulong)*(undefined8 *)pfStack_11e8 >> 0x20);
    fStack_2b0 = (float)*(undefined8 *)(pfStack_11e8 + 2);
    fStack_2ac = (float)((ulong)*(undefined8 *)(pfStack_11e8 + 2) >> 0x20);
    o1[3] = fStack_2b4 + fStack_634 * fVar4;
    o1[2] = local_2b8 + local_638 * fVar4;
    o0[1] = fStack_2ac + fStack_62c * fVar4;
    o0[0] = fStack_2b0 + fStack_630 * fVar4;
    local_2d8 = (float)*(undefined8 *)(pfStack_11e8 + 4);
    fStack_2d4 = (float)((ulong)*(undefined8 *)(pfStack_11e8 + 4) >> 0x20);
    fStack_2d0 = (float)*(undefined8 *)(pfStack_11e8 + 6);
    fStack_2cc = (float)((ulong)*(undefined8 *)(pfStack_11e8 + 6) >> 0x20);
    o2[3] = fStack_2d4 + fStack_654 * fVar4;
    o2[2] = local_2d8 + local_658 * fVar4;
    o1[1] = fStack_2cc + fStack_64c * fVar4;
    o1[0] = fStack_2d0 + fStack_650 * fVar4;
    local_2f8 = (float)*(undefined8 *)(pfStack_11e8 + 8);
    fStack_2f4 = (float)((ulong)*(undefined8 *)(pfStack_11e8 + 8) >> 0x20);
    fStack_2f0 = (float)*(undefined8 *)(pfStack_11e8 + 10);
    fStack_2ec = (float)((ulong)*(undefined8 *)(pfStack_11e8 + 10) >> 0x20);
    o3[3] = fStack_2f4 + fStack_674 * fVar4;
    o3[2] = local_2f8 + local_678 * fVar4;
    o2[1] = fStack_2ec + fStack_66c * fVar4;
    o2[0] = fStack_2f0 + fStack_670 * fVar4;
    local_318 = (float)*(undefined8 *)(pfStack_11e8 + 0xc);
    fStack_314 = (float)((ulong)*(undefined8 *)(pfStack_11e8 + 0xc) >> 0x20);
    fStack_310 = (float)*(undefined8 *)(pfStack_11e8 + 0xe);
    fStack_30c = (float)((ulong)*(undefined8 *)(pfStack_11e8 + 0xe) >> 0x20);
    r0[3] = fStack_314 + fStack_694 * fVar4;
    r0[2] = local_318 + local_698 * fVar4;
    o3[1] = fStack_30c + fStack_68c * fVar4;
    o3[0] = fStack_310 + fStack_690 * fVar4;
    *(undefined8 *)pfStack_11e8 = o1._8_8_;
    *(undefined8 *)(pfStack_11e8 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_11e8 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_11e8 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_11e8 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_11e8 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_11e8 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_11e8 + 0xe) = o3._0_8_;
    local_338 = (float)*(undefined8 *)pfStack_11f8;
    fStack_334 = (float)((ulong)*(undefined8 *)pfStack_11f8 >> 0x20);
    fStack_330 = (float)*(undefined8 *)(pfStack_11f8 + 2);
    fStack_32c = (float)((ulong)*(undefined8 *)(pfStack_11f8 + 2) >> 0x20);
    o1[3] = fStack_334 + fStack_634 * fVar5;
    o1[2] = local_338 + local_638 * fVar5;
    o0[1] = fStack_32c + fStack_62c * fVar5;
    o0[0] = fStack_330 + fStack_630 * fVar5;
    local_358 = (float)*(undefined8 *)(pfStack_11f8 + 4);
    fStack_354 = (float)((ulong)*(undefined8 *)(pfStack_11f8 + 4) >> 0x20);
    fStack_350 = (float)*(undefined8 *)(pfStack_11f8 + 6);
    fStack_34c = (float)((ulong)*(undefined8 *)(pfStack_11f8 + 6) >> 0x20);
    o2[3] = fStack_354 + fStack_654 * fVar5;
    o2[2] = local_358 + local_658 * fVar5;
    o1[1] = fStack_34c + fStack_64c * fVar5;
    o1[0] = fStack_350 + fStack_650 * fVar5;
    local_378 = (float)*(undefined8 *)(pfStack_11f8 + 8);
    fStack_374 = (float)((ulong)*(undefined8 *)(pfStack_11f8 + 8) >> 0x20);
    fStack_370 = (float)*(undefined8 *)(pfStack_11f8 + 10);
    fStack_36c = (float)((ulong)*(undefined8 *)(pfStack_11f8 + 10) >> 0x20);
    o3[3] = fStack_374 + fStack_674 * fVar5;
    o3[2] = local_378 + local_678 * fVar5;
    o2[1] = fStack_36c + fStack_66c * fVar5;
    o2[0] = fStack_370 + fStack_670 * fVar5;
    local_398 = (float)*(undefined8 *)(pfStack_11f8 + 0xc);
    fStack_394 = (float)((ulong)*(undefined8 *)(pfStack_11f8 + 0xc) >> 0x20);
    fStack_390 = (float)*(undefined8 *)(pfStack_11f8 + 0xe);
    fStack_38c = (float)((ulong)*(undefined8 *)(pfStack_11f8 + 0xe) >> 0x20);
    r0[3] = fStack_394 + fStack_694 * fVar5;
    r0[2] = local_398 + local_698 * fVar5;
    o3[1] = fStack_38c + fStack_68c * fVar5;
    o3[0] = fStack_390 + fStack_690 * fVar5;
    *(undefined8 *)pfStack_11f8 = o1._8_8_;
    *(undefined8 *)(pfStack_11f8 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_11f8 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_11f8 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_11f8 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_11f8 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_11f8 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_11f8 + 0xe) = o3._0_8_;
    local_3b8 = (float)*(undefined8 *)pfStack_1208;
    fStack_3b4 = (float)((ulong)*(undefined8 *)pfStack_1208 >> 0x20);
    fStack_3b0 = (float)*(undefined8 *)(pfStack_1208 + 2);
    fStack_3ac = (float)((ulong)*(undefined8 *)(pfStack_1208 + 2) >> 0x20);
    o1[3] = fStack_3b4 + fStack_634 * fVar6;
    o1[2] = local_3b8 + local_638 * fVar6;
    o0[1] = fStack_3ac + fStack_62c * fVar6;
    o0[0] = fStack_3b0 + fStack_630 * fVar6;
    local_3d8 = (float)*(undefined8 *)(pfStack_1208 + 4);
    fStack_3d4 = (float)((ulong)*(undefined8 *)(pfStack_1208 + 4) >> 0x20);
    fStack_3d0 = (float)*(undefined8 *)(pfStack_1208 + 6);
    fStack_3cc = (float)((ulong)*(undefined8 *)(pfStack_1208 + 6) >> 0x20);
    o2[3] = fStack_3d4 + fStack_654 * fVar6;
    o2[2] = local_3d8 + local_658 * fVar6;
    o1[1] = fStack_3cc + fStack_64c * fVar6;
    o1[0] = fStack_3d0 + fStack_650 * fVar6;
    local_3f8 = (float)*(undefined8 *)(pfStack_1208 + 8);
    fStack_3f4 = (float)((ulong)*(undefined8 *)(pfStack_1208 + 8) >> 0x20);
    fStack_3f0 = (float)*(undefined8 *)(pfStack_1208 + 10);
    fStack_3ec = (float)((ulong)*(undefined8 *)(pfStack_1208 + 10) >> 0x20);
    o3[3] = fStack_3f4 + fStack_674 * fVar6;
    o3[2] = local_3f8 + local_678 * fVar6;
    o2[1] = fStack_3ec + fStack_66c * fVar6;
    o2[0] = fStack_3f0 + fStack_670 * fVar6;
    local_418 = (float)*(undefined8 *)(pfStack_1208 + 0xc);
    fStack_414 = (float)((ulong)*(undefined8 *)(pfStack_1208 + 0xc) >> 0x20);
    fStack_410 = (float)*(undefined8 *)(pfStack_1208 + 0xe);
    fStack_40c = (float)((ulong)*(undefined8 *)(pfStack_1208 + 0xe) >> 0x20);
    r0[3] = fStack_414 + fStack_694 * fVar6;
    r0[2] = local_418 + local_698 * fVar6;
    o3[1] = fStack_40c + fStack_68c * fVar6;
    o3[0] = fStack_410 + fStack_690 * fVar6;
    *(undefined8 *)pfStack_1208 = o1._8_8_;
    *(undefined8 *)(pfStack_1208 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_1208 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_1208 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_1208 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_1208 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_1208 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_1208 + 0xe) = o3._0_8_;
    local_438 = (float)*(undefined8 *)pfStack_1218;
    fStack_434 = (float)((ulong)*(undefined8 *)pfStack_1218 >> 0x20);
    fStack_430 = (float)*(undefined8 *)(pfStack_1218 + 2);
    fStack_42c = (float)((ulong)*(undefined8 *)(pfStack_1218 + 2) >> 0x20);
    o1[3] = fStack_434 + fStack_634 * fVar7;
    o1[2] = local_438 + local_638 * fVar7;
    o0[1] = fStack_42c + fStack_62c * fVar7;
    o0[0] = fStack_430 + fStack_630 * fVar7;
    local_458 = (float)*(undefined8 *)(pfStack_1218 + 4);
    fStack_454 = (float)((ulong)*(undefined8 *)(pfStack_1218 + 4) >> 0x20);
    fStack_450 = (float)*(undefined8 *)(pfStack_1218 + 6);
    fStack_44c = (float)((ulong)*(undefined8 *)(pfStack_1218 + 6) >> 0x20);
    o2[3] = fStack_454 + fStack_654 * fVar7;
    o2[2] = local_458 + local_658 * fVar7;
    o1[1] = fStack_44c + fStack_64c * fVar7;
    o1[0] = fStack_450 + fStack_650 * fVar7;
    local_478 = (float)*(undefined8 *)(pfStack_1218 + 8);
    fStack_474 = (float)((ulong)*(undefined8 *)(pfStack_1218 + 8) >> 0x20);
    fStack_470 = (float)*(undefined8 *)(pfStack_1218 + 10);
    fStack_46c = (float)((ulong)*(undefined8 *)(pfStack_1218 + 10) >> 0x20);
    o3[3] = fStack_474 + fStack_674 * fVar7;
    o3[2] = local_478 + local_678 * fVar7;
    o2[1] = fStack_46c + fStack_66c * fVar7;
    o2[0] = fStack_470 + fStack_670 * fVar7;
    local_498 = (float)*(undefined8 *)(pfStack_1218 + 0xc);
    fStack_494 = (float)((ulong)*(undefined8 *)(pfStack_1218 + 0xc) >> 0x20);
    fStack_490 = (float)*(undefined8 *)(pfStack_1218 + 0xe);
    fStack_48c = (float)((ulong)*(undefined8 *)(pfStack_1218 + 0xe) >> 0x20);
    r0[3] = fStack_494 + fStack_694 * fVar7;
    r0[2] = local_498 + local_698 * fVar7;
    o3[1] = fStack_48c + fStack_68c * fVar7;
    o3[0] = fStack_490 + fStack_690 * fVar7;
    *(undefined8 *)pfStack_1218 = o1._8_8_;
    *(undefined8 *)(pfStack_1218 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_1218 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_1218 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_1218 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_1218 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_1218 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_1218 + 0xe) = o3._0_8_;
    local_4b8 = (float)*(undefined8 *)pfStack_1228;
    fStack_4b4 = (float)((ulong)*(undefined8 *)pfStack_1228 >> 0x20);
    fStack_4b0 = (float)*(undefined8 *)(pfStack_1228 + 2);
    fStack_4ac = (float)((ulong)*(undefined8 *)(pfStack_1228 + 2) >> 0x20);
    o1[3] = fStack_4b4 + fStack_634 * fVar8;
    o1[2] = local_4b8 + local_638 * fVar8;
    o0[1] = fStack_4ac + fStack_62c * fVar8;
    o0[0] = fStack_4b0 + fStack_630 * fVar8;
    local_4d8 = (float)*(undefined8 *)(pfStack_1228 + 4);
    fStack_4d4 = (float)((ulong)*(undefined8 *)(pfStack_1228 + 4) >> 0x20);
    fStack_4d0 = (float)*(undefined8 *)(pfStack_1228 + 6);
    fStack_4cc = (float)((ulong)*(undefined8 *)(pfStack_1228 + 6) >> 0x20);
    o2[3] = fStack_4d4 + fStack_654 * fVar8;
    o2[2] = local_4d8 + local_658 * fVar8;
    o1[1] = fStack_4cc + fStack_64c * fVar8;
    o1[0] = fStack_4d0 + fStack_650 * fVar8;
    local_4f8 = (float)*(undefined8 *)(pfStack_1228 + 8);
    fStack_4f4 = (float)((ulong)*(undefined8 *)(pfStack_1228 + 8) >> 0x20);
    fStack_4f0 = (float)*(undefined8 *)(pfStack_1228 + 10);
    fStack_4ec = (float)((ulong)*(undefined8 *)(pfStack_1228 + 10) >> 0x20);
    o3[3] = fStack_4f4 + fStack_674 * fVar8;
    o3[2] = local_4f8 + local_678 * fVar8;
    o2[1] = fStack_4ec + fStack_66c * fVar8;
    o2[0] = fStack_4f0 + fStack_670 * fVar8;
    local_518 = (float)*(undefined8 *)(pfStack_1228 + 0xc);
    fStack_514 = (float)((ulong)*(undefined8 *)(pfStack_1228 + 0xc) >> 0x20);
    fStack_510 = (float)*(undefined8 *)(pfStack_1228 + 0xe);
    fStack_50c = (float)((ulong)*(undefined8 *)(pfStack_1228 + 0xe) >> 0x20);
    r0[3] = fStack_514 + fStack_694 * fVar8;
    r0[2] = local_518 + local_698 * fVar8;
    o3[1] = fStack_50c + fStack_68c * fVar8;
    o3[0] = fStack_510 + fStack_690 * fVar8;
    *(undefined8 *)pfStack_1228 = o1._8_8_;
    *(undefined8 *)(pfStack_1228 + 2) = o0._0_8_;
    *(undefined8 *)(pfStack_1228 + 4) = o2._8_8_;
    *(undefined8 *)(pfStack_1228 + 6) = o1._0_8_;
    *(undefined8 *)(pfStack_1228 + 8) = o3._8_8_;
    *(undefined8 *)(pfStack_1228 + 10) = o2._0_8_;
    *(undefined8 *)(pfStack_1228 + 0xc) = r0._8_8_;
    *(undefined8 *)(pfStack_1228 + 0xe) = o3._0_8_;
    pfStack_11b8 = pfStack_11b8 + 0x10;
    pfStack_11c8 = pfStack_11c8 + 0x10;
    pfStack_11d8 = pfStack_11d8 + 0x10;
    pfStack_11e8 = pfStack_11e8 + 0x10;
    pfStack_11f8 = pfStack_11f8 + 0x10;
    pfStack_1208 = pfStack_1208 + 0x10;
    pfStack_1218 = pfStack_1218 + 0x10;
    pfStack_1228 = pfStack_1228 + 0x10;
  }
  for (; 0xf < (long)input_end - (long)input_end_local; input_end_local = input_end_local + 4) {
    local_a38 = (float)*(undefined8 *)input_end_local;
    fStack_a34 = (float)((ulong)*(undefined8 *)input_end_local >> 0x20);
    fStack_a30 = (float)*(undefined8 *)(input_end_local + 2);
    fStack_a2c = (float)((ulong)*(undefined8 *)(input_end_local + 2) >> 0x20);
    local_538 = (float)*(undefined8 *)pfStack_11b8;
    fStack_534 = (float)((ulong)*(undefined8 *)pfStack_11b8 >> 0x20);
    fStack_530 = (float)*(undefined8 *)(pfStack_11b8 + 2);
    fStack_52c = (float)((ulong)*(undefined8 *)(pfStack_11b8 + 2) >> 0x20);
    r0_1[3] = fStack_534 + fStack_a34 * fVar1;
    r0_1[2] = local_538 + local_a38 * fVar1;
    o0_1[1] = fStack_52c + fStack_a2c * fVar1;
    o0_1[0] = fStack_530 + fStack_a30 * fVar1;
    *(undefined8 *)pfStack_11b8 = r0_1._8_8_;
    *(undefined8 *)(pfStack_11b8 + 2) = o0_1._0_8_;
    local_558 = (float)*(undefined8 *)pfStack_11c8;
    fStack_554 = (float)((ulong)*(undefined8 *)pfStack_11c8 >> 0x20);
    fStack_550 = (float)*(undefined8 *)(pfStack_11c8 + 2);
    fStack_54c = (float)((ulong)*(undefined8 *)(pfStack_11c8 + 2) >> 0x20);
    r0_1[3] = fStack_554 + fStack_a34 * fVar2;
    r0_1[2] = local_558 + local_a38 * fVar2;
    o0_1[1] = fStack_54c + fStack_a2c * fVar2;
    o0_1[0] = fStack_550 + fStack_a30 * fVar2;
    *(undefined8 *)pfStack_11c8 = r0_1._8_8_;
    *(undefined8 *)(pfStack_11c8 + 2) = o0_1._0_8_;
    local_578 = (float)*(undefined8 *)pfStack_11d8;
    fStack_574 = (float)((ulong)*(undefined8 *)pfStack_11d8 >> 0x20);
    fStack_570 = (float)*(undefined8 *)(pfStack_11d8 + 2);
    fStack_56c = (float)((ulong)*(undefined8 *)(pfStack_11d8 + 2) >> 0x20);
    r0_1[3] = fStack_574 + fStack_a34 * fVar3;
    r0_1[2] = local_578 + local_a38 * fVar3;
    o0_1[1] = fStack_56c + fStack_a2c * fVar3;
    o0_1[0] = fStack_570 + fStack_a30 * fVar3;
    *(undefined8 *)pfStack_11d8 = r0_1._8_8_;
    *(undefined8 *)(pfStack_11d8 + 2) = o0_1._0_8_;
    local_598 = (float)*(undefined8 *)pfStack_11e8;
    fStack_594 = (float)((ulong)*(undefined8 *)pfStack_11e8 >> 0x20);
    fStack_590 = (float)*(undefined8 *)(pfStack_11e8 + 2);
    fStack_58c = (float)((ulong)*(undefined8 *)(pfStack_11e8 + 2) >> 0x20);
    r0_1[3] = fStack_594 + fStack_a34 * fVar4;
    r0_1[2] = local_598 + local_a38 * fVar4;
    o0_1[1] = fStack_58c + fStack_a2c * fVar4;
    o0_1[0] = fStack_590 + fStack_a30 * fVar4;
    *(undefined8 *)pfStack_11e8 = r0_1._8_8_;
    *(undefined8 *)(pfStack_11e8 + 2) = o0_1._0_8_;
    local_5b8 = (float)*(undefined8 *)pfStack_11f8;
    fStack_5b4 = (float)((ulong)*(undefined8 *)pfStack_11f8 >> 0x20);
    fStack_5b0 = (float)*(undefined8 *)(pfStack_11f8 + 2);
    fStack_5ac = (float)((ulong)*(undefined8 *)(pfStack_11f8 + 2) >> 0x20);
    r0_1[3] = fStack_5b4 + fStack_a34 * fVar5;
    r0_1[2] = local_5b8 + local_a38 * fVar5;
    o0_1[1] = fStack_5ac + fStack_a2c * fVar5;
    o0_1[0] = fStack_5b0 + fStack_a30 * fVar5;
    *(undefined8 *)pfStack_11f8 = r0_1._8_8_;
    *(undefined8 *)(pfStack_11f8 + 2) = o0_1._0_8_;
    local_5d8 = (float)*(undefined8 *)pfStack_1208;
    fStack_5d4 = (float)((ulong)*(undefined8 *)pfStack_1208 >> 0x20);
    fStack_5d0 = (float)*(undefined8 *)(pfStack_1208 + 2);
    fStack_5cc = (float)((ulong)*(undefined8 *)(pfStack_1208 + 2) >> 0x20);
    r0_1[3] = fStack_5d4 + fStack_a34 * fVar6;
    r0_1[2] = local_5d8 + local_a38 * fVar6;
    o0_1[1] = fStack_5cc + fStack_a2c * fVar6;
    o0_1[0] = fStack_5d0 + fStack_a30 * fVar6;
    *(undefined8 *)pfStack_1208 = r0_1._8_8_;
    *(undefined8 *)(pfStack_1208 + 2) = o0_1._0_8_;
    local_5f8 = (float)*(undefined8 *)pfStack_1218;
    fStack_5f4 = (float)((ulong)*(undefined8 *)pfStack_1218 >> 0x20);
    fStack_5f0 = (float)*(undefined8 *)(pfStack_1218 + 2);
    fStack_5ec = (float)((ulong)*(undefined8 *)(pfStack_1218 + 2) >> 0x20);
    r0_1[3] = fStack_5f4 + fStack_a34 * fVar7;
    r0_1[2] = local_5f8 + local_a38 * fVar7;
    o0_1[1] = fStack_5ec + fStack_a2c * fVar7;
    o0_1[0] = fStack_5f0 + fStack_a30 * fVar7;
    *(undefined8 *)pfStack_1218 = r0_1._8_8_;
    *(undefined8 *)(pfStack_1218 + 2) = o0_1._0_8_;
    local_618 = (float)*(undefined8 *)pfStack_1228;
    fStack_614 = (float)((ulong)*(undefined8 *)pfStack_1228 >> 0x20);
    fStack_610 = (float)*(undefined8 *)(pfStack_1228 + 2);
    fStack_60c = (float)((ulong)*(undefined8 *)(pfStack_1228 + 2) >> 0x20);
    r0_1[3] = fStack_614 + fStack_a34 * fVar8;
    r0_1[2] = local_618 + local_a38 * fVar8;
    o0_1[1] = fStack_60c + fStack_a2c * fVar8;
    o0_1[0] = fStack_610 + fStack_a30 * fVar8;
    *(undefined8 *)pfStack_1228 = r0_1._8_8_;
    *(undefined8 *)(pfStack_1228 + 2) = o0_1._0_8_;
    pfStack_11b8 = pfStack_11b8 + 4;
    pfStack_11c8 = pfStack_11c8 + 4;
    pfStack_11d8 = pfStack_11d8 + 4;
    pfStack_11e8 = pfStack_11e8 + 4;
    pfStack_11f8 = pfStack_11f8 + 4;
    pfStack_1208 = pfStack_1208 + 4;
    pfStack_1218 = pfStack_1218 + 4;
    pfStack_1228 = pfStack_1228 + 4;
  }
  for (; input_end_local < input_end; input_end_local = input_end_local + 1) {
    fVar9 = *input_end_local;
    *pfStack_11b8 = fVar9 * fVar1 + *pfStack_11b8;
    *pfStack_11c8 = fVar9 * fVar2 + *pfStack_11c8;
    *pfStack_11d8 = fVar9 * fVar3 + *pfStack_11d8;
    *pfStack_11e8 = fVar9 * fVar4 + *pfStack_11e8;
    *pfStack_11f8 = fVar9 * fVar5 + *pfStack_11f8;
    *pfStack_1208 = fVar9 * fVar6 + *pfStack_1208;
    *pfStack_1218 = fVar9 * fVar7 + *pfStack_1218;
    *pfStack_1228 = fVar9 * fVar8 + *pfStack_1228;
    pfStack_11b8 = pfStack_11b8 + 1;
    pfStack_11c8 = pfStack_11c8 + 1;
    pfStack_11d8 = pfStack_11d8 + 1;
    pfStack_11e8 = pfStack_11e8 + 1;
    pfStack_11f8 = pfStack_11f8 + 1;
    pfStack_1208 = pfStack_1208 + 1;
    pfStack_1218 = pfStack_1218 + 1;
    pfStack_1228 = pfStack_1228 + 1;
  }
  return;
}

Assistant:

static void STBIR_chans( stbir__vertical_scatter_with_,_coeffs)( float ** outputs, float const * vertical_coefficients, float const * input, float const * input_end )
{
  stbIF0( float STBIR_SIMD_STREAMOUT_PTR( * ) output0 = outputs[0]; float c0s = vertical_coefficients[0]; )
  stbIF1( float STBIR_SIMD_STREAMOUT_PTR( * ) output1 = outputs[1]; float c1s = vertical_coefficients[1]; )
  stbIF2( float STBIR_SIMD_STREAMOUT_PTR( * ) output2 = outputs[2]; float c2s = vertical_coefficients[2]; )
  stbIF3( float STBIR_SIMD_STREAMOUT_PTR( * ) output3 = outputs[3]; float c3s = vertical_coefficients[3]; )
  stbIF4( float STBIR_SIMD_STREAMOUT_PTR( * ) output4 = outputs[4]; float c4s = vertical_coefficients[4]; )
  stbIF5( float STBIR_SIMD_STREAMOUT_PTR( * ) output5 = outputs[5]; float c5s = vertical_coefficients[5]; )
  stbIF6( float STBIR_SIMD_STREAMOUT_PTR( * ) output6 = outputs[6]; float c6s = vertical_coefficients[6]; )
  stbIF7( float STBIR_SIMD_STREAMOUT_PTR( * ) output7 = outputs[7]; float c7s = vertical_coefficients[7]; )

  #ifdef STBIR_SIMD
  {
    stbIF0(stbir__simdfX c0 = stbir__simdf_frepX( c0s ); )
    stbIF1(stbir__simdfX c1 = stbir__simdf_frepX( c1s ); )
    stbIF2(stbir__simdfX c2 = stbir__simdf_frepX( c2s ); )
    stbIF3(stbir__simdfX c3 = stbir__simdf_frepX( c3s ); )
    stbIF4(stbir__simdfX c4 = stbir__simdf_frepX( c4s ); )
    stbIF5(stbir__simdfX c5 = stbir__simdf_frepX( c5s ); )
    stbIF6(stbir__simdfX c6 = stbir__simdf_frepX( c6s ); )
    stbIF7(stbir__simdfX c7 = stbir__simdf_frepX( c7s ); )
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= (16*stbir__simdfX_float_count) )
    {
      stbir__simdfX o0, o1, o2, o3, r0, r1, r2, r3;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdfX_load( r0, input );               stbir__simdfX_load( r1, input+stbir__simdfX_float_count );     stbir__simdfX_load( r2, input+(2*stbir__simdfX_float_count) );      stbir__simdfX_load( r3, input+(3*stbir__simdfX_float_count) );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdfX_load( o0, output0 );     stbir__simdfX_load( o1, output0+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output0+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output0+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c0 );  stbir__simdfX_madd( o1, o1, r1, c0 );  stbir__simdfX_madd( o2, o2, r2, c0 );   stbir__simdfX_madd( o3, o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_load( o0, output1 );     stbir__simdfX_load( o1, output1+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output1+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output1+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c1 );  stbir__simdfX_madd( o1, o1, r1, c1 );  stbir__simdfX_madd( o2, o2, r2, c1 );   stbir__simdfX_madd( o3, o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_load( o0, output2 );     stbir__simdfX_load( o1, output2+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output2+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output2+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c2 );  stbir__simdfX_madd( o1, o1, r1, c2 );  stbir__simdfX_madd( o2, o2, r2, c2 );   stbir__simdfX_madd( o3, o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_load( o0, output3 );     stbir__simdfX_load( o1, output3+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output3+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output3+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c3 );  stbir__simdfX_madd( o1, o1, r1, c3 );  stbir__simdfX_madd( o2, o2, r2, c3 );   stbir__simdfX_madd( o3, o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_load( o0, output4 );     stbir__simdfX_load( o1, output4+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output4+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output4+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c4 );  stbir__simdfX_madd( o1, o1, r1, c4 );  stbir__simdfX_madd( o2, o2, r2, c4 );   stbir__simdfX_madd( o3, o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_load( o0, output5 );     stbir__simdfX_load( o1, output5+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output5+(2*stbir__simdfX_float_count));    stbir__simdfX_load( o3, output5+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c5 );  stbir__simdfX_madd( o1, o1, r1, c5 );  stbir__simdfX_madd( o2, o2, r2, c5 );   stbir__simdfX_madd( o3, o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_load( o0, output6 );     stbir__simdfX_load( o1, output6+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output6+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output6+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c6 );  stbir__simdfX_madd( o1, o1, r1, c6 );  stbir__simdfX_madd( o2, o2, r2, c6 );   stbir__simdfX_madd( o3, o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_load( o0, output7 );     stbir__simdfX_load( o1, output7+stbir__simdfX_float_count );   stbir__simdfX_load( o2, output7+(2*stbir__simdfX_float_count) );    stbir__simdfX_load( o3, output7+(3*stbir__simdfX_float_count) );
              stbir__simdfX_madd( o0, o0, r0, c7 );  stbir__simdfX_madd( o1, o1, r1, c7 );  stbir__simdfX_madd( o2, o2, r2, c7 );   stbir__simdfX_madd( o3, o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #else
      stbIF0( stbir__simdfX_mult( o0, r0, c0 );      stbir__simdfX_mult( o1, r1, c0 );      stbir__simdfX_mult( o2, r2, c0 );       stbir__simdfX_mult( o3, r3, c0 );
              stbir__simdfX_store( output0, o0 );    stbir__simdfX_store( output0+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output0+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output0+(3*stbir__simdfX_float_count), o3 ); )
      stbIF1( stbir__simdfX_mult( o0, r0, c1 );      stbir__simdfX_mult( o1, r1, c1 );      stbir__simdfX_mult( o2, r2, c1 );       stbir__simdfX_mult( o3, r3, c1 );
              stbir__simdfX_store( output1, o0 );    stbir__simdfX_store( output1+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output1+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output1+(3*stbir__simdfX_float_count), o3 ); )
      stbIF2( stbir__simdfX_mult( o0, r0, c2 );      stbir__simdfX_mult( o1, r1, c2 );      stbir__simdfX_mult( o2, r2, c2 );       stbir__simdfX_mult( o3, r3, c2 );
              stbir__simdfX_store( output2, o0 );    stbir__simdfX_store( output2+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output2+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output2+(3*stbir__simdfX_float_count), o3 ); )
      stbIF3( stbir__simdfX_mult( o0, r0, c3 );      stbir__simdfX_mult( o1, r1, c3 );      stbir__simdfX_mult( o2, r2, c3 );       stbir__simdfX_mult( o3, r3, c3 );
              stbir__simdfX_store( output3, o0 );    stbir__simdfX_store( output3+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output3+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output3+(3*stbir__simdfX_float_count), o3 ); )
      stbIF4( stbir__simdfX_mult( o0, r0, c4 );      stbir__simdfX_mult( o1, r1, c4 );      stbir__simdfX_mult( o2, r2, c4 );       stbir__simdfX_mult( o3, r3, c4 );
              stbir__simdfX_store( output4, o0 );    stbir__simdfX_store( output4+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output4+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output4+(3*stbir__simdfX_float_count), o3 ); )
      stbIF5( stbir__simdfX_mult( o0, r0, c5 );      stbir__simdfX_mult( o1, r1, c5 );      stbir__simdfX_mult( o2, r2, c5 );       stbir__simdfX_mult( o3, r3, c5 );
              stbir__simdfX_store( output5, o0 );    stbir__simdfX_store( output5+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output5+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output5+(3*stbir__simdfX_float_count), o3 ); )
      stbIF6( stbir__simdfX_mult( o0, r0, c6 );      stbir__simdfX_mult( o1, r1, c6 );      stbir__simdfX_mult( o2, r2, c6 );       stbir__simdfX_mult( o3, r3, c6 );
              stbir__simdfX_store( output6, o0 );    stbir__simdfX_store( output6+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output6+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output6+(3*stbir__simdfX_float_count), o3 ); )
      stbIF7( stbir__simdfX_mult( o0, r0, c7 );      stbir__simdfX_mult( o1, r1, c7 );      stbir__simdfX_mult( o2, r2, c7 );       stbir__simdfX_mult( o3, r3, c7 );
              stbir__simdfX_store( output7, o0 );    stbir__simdfX_store( output7+stbir__simdfX_float_count, o1 );  stbir__simdfX_store( output7+(2*stbir__simdfX_float_count), o2 );   stbir__simdfX_store( output7+(3*stbir__simdfX_float_count), o3 ); )
      #endif

      input += (4*stbir__simdfX_float_count);
      stbIF0( output0 += (4*stbir__simdfX_float_count); ) stbIF1( output1 += (4*stbir__simdfX_float_count); ) stbIF2( output2 += (4*stbir__simdfX_float_count); ) stbIF3( output3 += (4*stbir__simdfX_float_count); ) stbIF4( output4 += (4*stbir__simdfX_float_count); ) stbIF5( output5 += (4*stbir__simdfX_float_count); ) stbIF6( output6 += (4*stbir__simdfX_float_count); ) stbIF7( output7 += (4*stbir__simdfX_float_count); )
    }
    STBIR_SIMD_NO_UNROLL_LOOP_START
    while ( ( (char*)input_end - (char*) input ) >= 16 )
    {
      stbir__simdf o0, r0;
      STBIR_SIMD_NO_UNROLL(output0);

      stbir__simdf_load( r0, input );

      #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
      stbIF0( stbir__simdf_load( o0, output0 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );  stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_load( o0, output1 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );  stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_load( o0, output2 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );  stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_load( o0, output3 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );  stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_load( o0, output4 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );  stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_load( o0, output5 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );  stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_load( o0, output6 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );  stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_load( o0, output7 );  stbir__simdf_madd( o0, o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );  stbir__simdf_store( output7, o0 ); )
      #else
      stbIF0( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c0 ) );   stbir__simdf_store( output0, o0 ); )
      stbIF1( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c1 ) );   stbir__simdf_store( output1, o0 ); )
      stbIF2( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c2 ) );   stbir__simdf_store( output2, o0 ); )
      stbIF3( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c3 ) );   stbir__simdf_store( output3, o0 ); )
      stbIF4( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c4 ) );   stbir__simdf_store( output4, o0 ); )
      stbIF5( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c5 ) );   stbir__simdf_store( output5, o0 ); )
      stbIF6( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c6 ) );   stbir__simdf_store( output6, o0 ); )
      stbIF7( stbir__simdf_mult( o0, r0, stbir__if_simdf8_cast_to_simdf4( c7 ) );   stbir__simdf_store( output7, o0 ); )
      #endif

      input += 4;
      stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
    }
  }
  #else
  STBIR_NO_UNROLL_LOOP_START
  while ( ( (char*)input_end - (char*) input ) >= 16 )
  {
    float r0, r1, r2, r3;
    STBIR_NO_UNROLL(input);

    r0 = input[0], r1 = input[1], r2 = input[2], r3 = input[3];

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r0 * c0s ); output0[1] += ( r1 * c0s ); output0[2] += ( r2 * c0s ); output0[3] += ( r3 * c0s ); )
    stbIF1( output1[0] += ( r0 * c1s ); output1[1] += ( r1 * c1s ); output1[2] += ( r2 * c1s ); output1[3] += ( r3 * c1s ); )
    stbIF2( output2[0] += ( r0 * c2s ); output2[1] += ( r1 * c2s ); output2[2] += ( r2 * c2s ); output2[3] += ( r3 * c2s ); )
    stbIF3( output3[0] += ( r0 * c3s ); output3[1] += ( r1 * c3s ); output3[2] += ( r2 * c3s ); output3[3] += ( r3 * c3s ); )
    stbIF4( output4[0] += ( r0 * c4s ); output4[1] += ( r1 * c4s ); output4[2] += ( r2 * c4s ); output4[3] += ( r3 * c4s ); )
    stbIF5( output5[0] += ( r0 * c5s ); output5[1] += ( r1 * c5s ); output5[2] += ( r2 * c5s ); output5[3] += ( r3 * c5s ); )
    stbIF6( output6[0] += ( r0 * c6s ); output6[1] += ( r1 * c6s ); output6[2] += ( r2 * c6s ); output6[3] += ( r3 * c6s ); )
    stbIF7( output7[0] += ( r0 * c7s ); output7[1] += ( r1 * c7s ); output7[2] += ( r2 * c7s ); output7[3] += ( r3 * c7s ); )
    #else
    stbIF0( output0[0]  = ( r0 * c0s ); output0[1]  = ( r1 * c0s ); output0[2]  = ( r2 * c0s ); output0[3]  = ( r3 * c0s ); )
    stbIF1( output1[0]  = ( r0 * c1s ); output1[1]  = ( r1 * c1s ); output1[2]  = ( r2 * c1s ); output1[3]  = ( r3 * c1s ); )
    stbIF2( output2[0]  = ( r0 * c2s ); output2[1]  = ( r1 * c2s ); output2[2]  = ( r2 * c2s ); output2[3]  = ( r3 * c2s ); )
    stbIF3( output3[0]  = ( r0 * c3s ); output3[1]  = ( r1 * c3s ); output3[2]  = ( r2 * c3s ); output3[3]  = ( r3 * c3s ); )
    stbIF4( output4[0]  = ( r0 * c4s ); output4[1]  = ( r1 * c4s ); output4[2]  = ( r2 * c4s ); output4[3]  = ( r3 * c4s ); )
    stbIF5( output5[0]  = ( r0 * c5s ); output5[1]  = ( r1 * c5s ); output5[2]  = ( r2 * c5s ); output5[3]  = ( r3 * c5s ); )
    stbIF6( output6[0]  = ( r0 * c6s ); output6[1]  = ( r1 * c6s ); output6[2]  = ( r2 * c6s ); output6[3]  = ( r3 * c6s ); )
    stbIF7( output7[0]  = ( r0 * c7s ); output7[1]  = ( r1 * c7s ); output7[2]  = ( r2 * c7s ); output7[3]  = ( r3 * c7s ); )
    #endif

    input += 4;
    stbIF0( output0 += 4; ) stbIF1( output1 += 4; ) stbIF2( output2 += 4; ) stbIF3( output3 += 4; ) stbIF4( output4 += 4; ) stbIF5( output5 += 4; ) stbIF6( output6 += 4; ) stbIF7( output7 += 4; )
  }
  #endif
  STBIR_NO_UNROLL_LOOP_START
  while ( input < input_end )
  {
    float r = input[0];
    STBIR_NO_UNROLL(output0);

    #ifdef STB_IMAGE_RESIZE_VERTICAL_CONTINUE
    stbIF0( output0[0] += ( r * c0s ); )
    stbIF1( output1[0] += ( r * c1s ); )
    stbIF2( output2[0] += ( r * c2s ); )
    stbIF3( output3[0] += ( r * c3s ); )
    stbIF4( output4[0] += ( r * c4s ); )
    stbIF5( output5[0] += ( r * c5s ); )
    stbIF6( output6[0] += ( r * c6s ); )
    stbIF7( output7[0] += ( r * c7s ); )
    #else
    stbIF0( output0[0]  = ( r * c0s ); )
    stbIF1( output1[0]  = ( r * c1s ); )
    stbIF2( output2[0]  = ( r * c2s ); )
    stbIF3( output3[0]  = ( r * c3s ); )
    stbIF4( output4[0]  = ( r * c4s ); )
    stbIF5( output5[0]  = ( r * c5s ); )
    stbIF6( output6[0]  = ( r * c6s ); )
    stbIF7( output7[0]  = ( r * c7s ); )
    #endif

    ++input;
    stbIF0( ++output0; ) stbIF1( ++output1; ) stbIF2( ++output2; ) stbIF3( ++output3; ) stbIF4( ++output4; ) stbIF5( ++output5; ) stbIF6( ++output6; ) stbIF7( ++output7; )
  }
}